

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

int32_t player_adjust_mana_precise(player *p,int32_t sp_gain)

{
  uint32_t *puVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  sVar2 = p->csp;
  iVar3 = CONCAT22(sVar2,p->csp_frac);
  if (sp_gain == 0) {
    return 0;
  }
  if (sp_gain < 1) {
    if (-0x80000000 - sp_gain < iVar3) goto LAB_001c0b40;
    p->csp = -0x8000;
    sp_gain = 0;
    uVar5 = 0x8000;
LAB_001c0ba1:
    p->csp_frac = 0;
    uVar4 = 0;
  }
  else {
    if (iVar3 < (int)(sp_gain ^ 0x7fffffffU)) {
LAB_001c0b40:
      uVar4 = iVar3 + sp_gain;
      if ((int)uVar4 < 0) {
        uVar6 = -uVar4 >> 0x10;
        uVar5 = -uVar6;
        p->csp = (int16_t)uVar5;
        if ((short)-uVar4 == 0) goto LAB_001c0ba1;
        p->csp_frac = (uint16_t)uVar4;
        if (uVar6 == 0x8000) {
          __assert_fail("p->csp > INT16_MIN",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-util.c"
                        ,0x2db,"int32_t player_adjust_mana_precise(struct player *, int32_t)");
        }
        uVar5 = ~uVar6;
        p->csp = (int16_t)uVar5;
        goto LAB_001c0ba9;
      }
    }
    else {
      sp_gain = 0;
      uVar4 = 0x7fffffff;
    }
    uVar5 = uVar4 >> 0x10;
    uVar6 = uVar4 >> 0x10 | uVar4 << 0x10;
    p->csp = (short)uVar6;
    p->csp_frac = (short)(uVar6 >> 0x10);
  }
LAB_001c0ba9:
  uVar6 = (uint)(ushort)p->msp;
  if ((short)uVar5 < p->msp) {
    uVar6 = uVar5;
    if (-1 < (short)uVar5) goto LAB_001c0bcf;
    uVar6 = 0;
  }
  p->csp = (int16_t)uVar6;
  p->csp_frac = 0;
  uVar4 = 0;
  sp_gain = 0;
LAB_001c0bcf:
  if (sVar2 != (short)uVar6) {
    puVar1 = &p->upkeep->redraw;
    *puVar1 = *puVar1 | 0x80;
  }
  if (sp_gain == 0) {
    sp_gain = (uVar6 * 0x10000 - iVar3) + (uVar4 & 0xffff);
  }
  return sp_gain;
}

Assistant:

int32_t player_adjust_mana_precise(struct player *p, int32_t sp_gain)
{
	int16_t old_16 = p->csp;
	/* Load it all into 4 byte format*/
	int32_t old_32 = ((int32_t) p->csp) * 65536 + p->csp_frac, new_32;

	if (sp_gain == 0) return 0;

	/* Check for overflow */
	if (sp_gain > 0) {
		if (old_32 < INT32_MAX - sp_gain) {
			new_32 = old_32 + sp_gain;
		} else {
			new_32 = INT32_MAX;
			sp_gain = 0;
		}
	} else if (old_32 > INT32_MIN - sp_gain) {
		new_32 = old_32 + sp_gain;
	} else {
		new_32 = INT32_MIN;
		sp_gain = 0;
	}

	/* Break it back down*/
	if (new_32 < 0) {
		/*
		 * Don't use right bitwise shift on negative values:  whether
		 * the left bits are zero or one depends on the system.
		 */
		int32_t remainder = new_32 % 65536;

		p->csp = (int16_t) (new_32 / 65536);
		if (remainder) {
			assert(remainder < 0);
			p->csp_frac = (uint16_t) (65536 + remainder);
			assert(p->csp > INT16_MIN);
			p->csp -= 1;
		} else {
			p->csp_frac = 0;
		}
	} else {
		p->csp = (int16_t)(new_32 >> 16);   /* div 65536 */
		p->csp_frac = (uint16_t)(new_32 & 0xFFFF);    /* mod 65536 */
	}

	/* Max/min SP */
	if (p->csp >= p->msp) {
		p->csp = p->msp;
		p->csp_frac = 0;
		sp_gain = 0;
	} else if (p->csp < 0) {
		p->csp = 0;
		p->csp_frac = 0;
		sp_gain = 0;
	}

	/* Notice changes */
	if (old_16 != p->csp) {
		p->upkeep->redraw |= (PR_MANA);
	}

	if (sp_gain == 0) {
		/* Recalculate */
		new_32 = ((int32_t) p->csp) * 65536 + p->csp_frac;
		sp_gain = new_32 - old_32;
	}

	return sp_gain;
}